

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMull<(moira::Instr)156,(moira::Mode)4,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *this_00;
  char *str_00;
  bool bVar3;
  Ea<(moira::Mode)4,_4> src;
  Av<(moira::Instr)156,_(moira::Mode)4,_4> local_48;
  u32 local_44;
  ushort local_40;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  local_40 = op & 7;
  local_44 = *addr;
  bVar3 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  str_00 = ":";
  if (bVar3) {
    str_00 = ",";
  }
  if ((uVar2 & 0x83f8) == 0 || !bVar3) {
    if ((uVar2 >> 0xb & 1) == 0) {
      StrWriter::operator<<();
    }
    else {
      StrWriter::operator<<(str);
    }
    this_00 = StrWriter::operator<<(str);
    StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
    StrWriter::operator<<(this_00,(Ea<(moira::Mode)4,_4> *)&local_44);
    StrWriter::operator<<(this_00);
    if ((uVar2 >> 10 & 1) != 0) {
      StrWriter::operator<<(str,(Dn)(uVar2 & 7));
      StrWriter::operator<<(str,str_00);
    }
    StrWriter::operator<<(str,(Dn)(uVar2 >> 0xc & 7));
    local_48.ext1 = 0;
    StrWriter::operator<<(str,&local_48);
    return;
  }
  *addr = uVar1;
  dasmIllegal<(moira::Instr)156,(moira::Mode)4,4>(this,str,addr,op);
  return;
}

Assistant:

void
Moira::dasmMull(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::MULS>{} : str << Ins<Instr::MULU>{};
            str << Sz<S>{} << str.tab << src << Sep{};
            (ext & 1 << 10) ? str << dh << fill << dl : str << dl;
            str << Av<I, M, S>{};
    }
}